

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

Result __thiscall
doctest::detail::Expression_lhs<signed_char_const&>::operator==
          (Expression_lhs<signed_char_const&> *this,int *rhs)

{
  char cVar1;
  int iVar2;
  int *in_RDX;
  String extraout_RDX;
  Result RVar3;
  void *local_20;
  
  cVar1 = **(char **)rhs;
  iVar2 = *in_RDX;
  stringifyBinaryExpr<signed_char,int>((detail *)&local_20,*(char **)rhs," == ",in_RDX);
  Result::Result((Result *)this,iVar2 == cVar1,(String *)&local_20);
  free(local_20);
  RVar3.m_decomposition.m_str = extraout_RDX.m_str;
  RVar3._0_8_ = this;
  return RVar3;
}

Assistant:

Result operator==(const DOCTEST_REF_WRAP(R) rhs) { return Result(lhs == rhs, stringifyBinaryExpr(lhs, " == ", rhs)); }